

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_sig_recover
              (secp256k1_scalar *sigr,secp256k1_scalar *sigs,secp256k1_ge *pubkey,
              secp256k1_scalar *message,int recid)

{
  int iVar1;
  int iVar2;
  uint in_R8D;
  int r;
  secp256k1_gej qj;
  secp256k1_scalar u2;
  secp256k1_scalar u1;
  secp256k1_scalar rn;
  secp256k1_gej xj;
  secp256k1_ge x;
  secp256k1_fe fx;
  uchar brx [32];
  secp256k1_scalar *in_stack_000005e8;
  secp256k1_scalar *in_stack_000005f0;
  secp256k1_gej *in_stack_000005f8;
  secp256k1_gej *in_stack_00000600;
  secp256k1_ge *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  secp256k1_scalar *in_stack_fffffffffffffdc8;
  secp256k1_scalar *in_stack_fffffffffffffdd0;
  secp256k1_scalar *in_stack_fffffffffffffdd8;
  secp256k1_scalar *in_stack_fffffffffffffde0;
  secp256k1_scalar *in_stack_fffffffffffffdf0;
  secp256k1_scalar *in_stack_fffffffffffffdf8;
  secp256k1_scalar *in_stack_fffffffffffffe00;
  secp256k1_gej *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  secp256k1_fe *in_stack_fffffffffffffe18;
  secp256k1_ge *in_stack_fffffffffffffe20;
  secp256k1_fe local_80 [2];
  uint local_2c;
  
  local_2c = in_R8D;
  iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x475b8c);
  if ((iVar1 != 0) || (iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x475b9e), iVar1 != 0))
  {
    return 0;
  }
  secp256k1_scalar_get_b32
            ((uchar *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             (secp256k1_scalar *)in_stack_fffffffffffffdb8);
  iVar1 = secp256k1_fe_impl_set_b32_limit
                    ((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     (uchar *)in_stack_fffffffffffffdb8);
  if ((local_2c & 2) != 0) {
    iVar2 = secp256k1_fe_impl_cmp_var(local_80,&secp256k1_ecdsa_const_p_minus_order);
    if (-1 < iVar2) {
      return 0;
    }
    secp256k1_fe_impl_add(local_80,&secp256k1_ecdsa_const_order_as_fe);
  }
  iVar2 = secp256k1_ge_set_xo_var
                    (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
  if (iVar2 == 0) {
    return 0;
  }
  secp256k1_gej_set_ge
            ((secp256k1_gej *)CONCAT44(iVar1,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdb8);
  secp256k1_scalar_inverse_var(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  secp256k1_scalar_mul
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  secp256k1_scalar_negate(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  secp256k1_scalar_mul
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  secp256k1_ecmult(in_stack_00000600,in_stack_000005f8,in_stack_000005f0,in_stack_000005e8);
  secp256k1_ge_set_gej_var
            ((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
             in_stack_fffffffffffffe08);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x475d13);
  return (uint)((iVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

static int secp256k1_ecdsa_sig_recover(const secp256k1_scalar *sigr, const secp256k1_scalar* sigs, secp256k1_ge *pubkey, const secp256k1_scalar *message, int recid) {
    unsigned char brx[32];
    secp256k1_fe fx;
    secp256k1_ge x;
    secp256k1_gej xj;
    secp256k1_scalar rn, u1, u2;
    secp256k1_gej qj;
    int r;

    if (secp256k1_scalar_is_zero(sigr) || secp256k1_scalar_is_zero(sigs)) {
        return 0;
    }

    secp256k1_scalar_get_b32(brx, sigr);
    r = secp256k1_fe_set_b32_limit(&fx, brx);
    (void)r;
    VERIFY_CHECK(r); /* brx comes from a scalar, so is less than the order; certainly less than p */
    if (recid & 2) {
        if (secp256k1_fe_cmp_var(&fx, &secp256k1_ecdsa_const_p_minus_order) >= 0) {
            return 0;
        }
        secp256k1_fe_add(&fx, &secp256k1_ecdsa_const_order_as_fe);
    }
    if (!secp256k1_ge_set_xo_var(&x, &fx, recid & 1)) {
        return 0;
    }
    secp256k1_gej_set_ge(&xj, &x);
    secp256k1_scalar_inverse_var(&rn, sigr);
    secp256k1_scalar_mul(&u1, &rn, message);
    secp256k1_scalar_negate(&u1, &u1);
    secp256k1_scalar_mul(&u2, &rn, sigs);
    secp256k1_ecmult(&qj, &xj, &u2, &u1);
    secp256k1_ge_set_gej_var(pubkey, &qj);
    return !secp256k1_gej_is_infinity(&qj);
}